

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeReaderInit(NodeReader *p,char *aNode,int nNode)

{
  int iVar1;
  int nNode_local;
  char *aNode_local;
  NodeReader *p_local;
  
  memset(p,0,0x38);
  p->aNode = aNode;
  p->nNode = nNode;
  if (*p->aNode == '\0') {
    p->iOff = 1;
  }
  else {
    iVar1 = sqlite3Fts3GetVarint(p->aNode + 1,&p->iChild);
    p->iOff = iVar1 + 1;
  }
  iVar1 = nodeReaderNext(p);
  return iVar1;
}

Assistant:

static int nodeReaderInit(NodeReader *p, const char *aNode, int nNode){
  memset(p, 0, sizeof(NodeReader));
  p->aNode = aNode;
  p->nNode = nNode;

  /* Figure out if this is a leaf or an internal node. */
  if( p->aNode[0] ){
    /* An internal node. */
    p->iOff = 1 + sqlite3Fts3GetVarint(&p->aNode[1], &p->iChild);
  }else{
    p->iOff = 1;
  }

  return nodeReaderNext(p);
}